

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

int archive_read_data_block(archive *a,void **buff,size_t *s,int64_t *o)

{
  int iVar1;
  
  iVar1 = (*a->vtable->archive_read_data_block)(a,buff,s,o);
  return iVar1;
}

Assistant:

static int
_archive_read_data_block(struct archive *_a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct archive_read *a = (struct archive_read *)_a;
	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_DATA,
	    "archive_read_data_block");

	if (a->format->read_data == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Internal error: "
		    "No format_read_data_block function registered");
		return (ARCHIVE_FATAL);
	}

	return (a->format->read_data)(a, buff, size, offset);
}